

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> __thiscall
cmList::TransformSelector::NewREGEX(TransformSelector *this,string *regex)

{
  uint uVar1;
  pointer pTVar2;
  transform_error *this_00;
  string local_58;
  undefined1 local_28 [8];
  unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  local_20;
  unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  selector;
  string *regex_local;
  
  selector._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
        )(__uniq_ptr_data<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>,_true,_true>
          )regex;
  std::make_unique<(anonymous_namespace)::TransformSelectorRegex,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::
  unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
  ::
  unique_ptr<(anonymous_namespace)::TransformSelectorRegex,std::default_delete<(anonymous_namespace)::TransformSelectorRegex>,void>
            ((unique_ptr<(anonymous_namespace)::TransformSelector,std::default_delete<(anonymous_namespace)::TransformSelector>>
              *)&local_20,
             (unique_ptr<(anonymous_namespace)::TransformSelectorRegex,_std::default_delete<(anonymous_namespace)::TransformSelectorRegex>_>
              *)local_28);
  std::
  unique_ptr<(anonymous_namespace)::TransformSelectorRegex,_std::default_delete<(anonymous_namespace)::TransformSelectorRegex>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformSelectorRegex,_std::default_delete<(anonymous_namespace)::TransformSelectorRegex>_>
                 *)local_28);
  pTVar2 = std::
           unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           ::operator->(&local_20);
  uVar1 = (*(pTVar2->super_TransformSelector)._vptr_TransformSelector[3])(pTVar2,0);
  if ((uVar1 & 1) == 0) {
    this_00 = (transform_error *)__cxa_allocate_exception(0x10);
    cmStrCat<char_const(&)[64],std::__cxx11::string&,char_const(&)[3]>
              (&local_58,
               (char (*) [64])"sub-command TRANSFORM, selector REGEX failed to compile regex \"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               selector._M_t.
               super___uniq_ptr_impl<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               ._M_t.
               super__Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
               .super__Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>.
               _M_head_impl,(char (*) [3])0x11185a2);
    transform_error::transform_error(this_00,&local_58);
    __cxa_throw(this_00,&transform_error::typeinfo,transform_error::~transform_error);
  }
  pTVar2 = std::
           unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
           ::release(&local_20);
  std::unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>::
  unique_ptr<std::default_delete<cmList::TransformSelector>,void>
            ((unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>> *
             )this,&pTVar2->super_TransformSelector);
  std::
  unique_ptr<(anonymous_namespace)::TransformSelector,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
  ::~unique_ptr(&local_20);
  return (__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
          )(__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmList::TransformSelector> cmList::TransformSelector::NewREGEX(
  std::string&& regex)
{
  std::unique_ptr<::TransformSelector> selector =
    cm::make_unique<TransformSelectorRegex>(std::move(regex));
  if (!selector->Validate()) {
    throw transform_error(
      cmStrCat("sub-command TRANSFORM, selector REGEX failed to compile "
               "regex \"",
               regex, "\"."));
  }
  // weird construct to please all compilers
  return std::unique_ptr<cmList::TransformSelector>(selector.release());
}